

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Layer *pLVar11;
  void *pvVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  void *pvVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [16];
  int iVar26;
  size_t sVar27;
  ulong uVar28;
  bool bVar29;
  float fVar30;
  undefined1 auVar31 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  ParamDict pd;
  long local_570;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  ModelBinFromMatArray local_4a0;
  ParamDict local_490;
  
  local_490.params[0].v.elemsize._0_4_ = bottom_blob->dims;
  if (this->kernel_h == 1 && (this->kernel_w == 1 && (int)local_490.params[0].v.elemsize == 1)) {
    iVar19 = bottom_blob->w;
    if (iVar19 == this->weight_data_size / this->num_output) {
      pLVar11 = create_layer(0xf);
      ParamDict::ParamDict(&local_490);
      ParamDict::set(&local_490,0,this->num_output);
      ParamDict::set(&local_490,1,this->bias_term);
      ParamDict::set(&local_490,2,this->weight_data_size);
      (*pLVar11->_vptr_Layer[2])(pLVar11,&local_490);
      local_4b8 = (undefined1  [16])0x0;
      local_4c8 = (undefined1  [16])0x0;
      local_4d8 = (undefined1  [16])0x0;
      local_4e8 = (undefined1  [16])0x0;
      local_4f8 = (undefined1  [16])0x0;
      local_508 = (undefined1  [16])0x0;
      if ((Mat *)local_508 != &this->weight_data) {
        piVar2 = (this->weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_508._0_8_ = (this->weight_data).data;
        local_508._8_8_ = (this->weight_data).refcount;
        local_4f8._0_8_ = (this->weight_data).elemsize;
        local_4f8._8_4_ = (this->weight_data).dims;
        local_4f8._12_4_ = (this->weight_data).w;
        local_4e8._0_4_ = (this->weight_data).h;
        local_4e8._4_4_ = (this->weight_data).c;
        local_4e8._8_8_ = (this->weight_data).cstep;
      }
      if ((Mat *)local_4d8 != &this->bias_data) {
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_4d8._0_8_ = (this->bias_data).data;
        local_4d8._8_8_ = (this->bias_data).refcount;
        local_4c8._0_8_ = (this->bias_data).elemsize;
        local_4c8._8_4_ = (this->bias_data).dims;
        local_4c8._12_4_ = (this->bias_data).w;
        local_4b8._0_4_ = (this->bias_data).h;
        local_4b8._4_4_ = (this->bias_data).c;
        local_4b8._8_8_ = (this->bias_data).cstep;
      }
      ModelBinFromMatArray::ModelBinFromMatArray(&local_4a0,(Mat *)local_508);
      (*pLVar11->_vptr_Layer[3])(pLVar11,&local_4a0);
      (*pLVar11->_vptr_Layer[5])(pLVar11,bottom_blob,top_blob);
      (*pLVar11->_vptr_Layer[1])(pLVar11);
      lVar18 = 0x30;
      do {
        piVar2 = *(int **)(local_508 + lVar18 + 8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) &&
             (lVar3 = *(long *)*(undefined1 (*) [16])(local_508 + lVar18), lVar3 != 0)) {
            free(*(void **)(lVar3 + -8));
          }
        }
        *(undefined1 (*) [16])(local_4e8 + lVar18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_4f8 + lVar18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_508 + lVar18) = (undefined1  [16])0x0;
        lVar18 = lVar18 + -0x30;
      } while (lVar18 != -0x30);
      lVar18 = 0x430;
      do {
        pauVar25 = (undefined1 (*) [16])((long)&local_490.params[0].loaded + lVar18);
        piVar2 = *(int **)((long)&local_490.params[0].v.data + lVar18);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (lVar3 = *(long *)*pauVar25, lVar3 != 0)) {
            free(*(void **)(lVar3 + -8));
          }
        }
        *(undefined1 (*) [16])((long)&local_490.params[0].v.dims + lVar18) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&local_490.params[0].v.refcount + lVar18) =
             (undefined1  [16])0x0;
        *pauVar25 = (undefined1  [16])0x0;
        lVar18 = lVar18 + -0x38;
      } while (lVar18 != -0x30);
      return 0;
    }
  }
  else {
    iVar19 = bottom_blob->w;
  }
  uVar24 = (this->kernel_w + -1) * this->dilation_w;
  iVar10 = bottom_blob->h;
  uVar23 = (this->kernel_h + -1) * this->dilation_h;
  uVar1 = bottom_blob->c;
  local_490.params[0]._0_8_ = bottom_blob->data;
  local_490.params[0].v.data = bottom_blob->refcount;
  local_490.params[0].v.refcount = (int *)bottom_blob->elemsize;
  local_490.params[0].v.dims = iVar10;
  local_490.params[0].v.elemsize._4_4_ = iVar19;
  local_490.params[0].v.w = uVar1;
  if ((int *)local_490.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)local_490.params[0].v.data = *local_490.params[0].v.data + 1;
    UNLOCK();
    local_490.params[0].v.elemsize._4_4_ = bottom_blob->w;
    local_490.params[0].v.dims = bottom_blob->h;
    local_490.params[0].v.w = bottom_blob->c;
  }
  local_490.params[0].v._32_8_ = bottom_blob->cstep;
  iVar14 = this->pad_w;
  iVar7 = this->pad_h;
  if (iVar7 < 1 && iVar14 < 1) {
    if (iVar7 == -0xe9 && iVar14 == -0xe9) {
      iVar7 = uVar24 - (iVar19 + -1) % this->stride_w;
      iVar14 = uVar23 - (iVar10 + -1) % this->stride_h;
      if ((0 < iVar7) ||
         (iVar10 = local_490.params[0].v.dims, iVar19 = local_490.params[0].v.elemsize._4_4_,
         0 < iVar14)) {
        copy_make_border(bottom_blob,(Mat *)&local_490,iVar14 / 2,iVar14 - iVar14 / 2,iVar7 / 2,
                         iVar7 - iVar7 / 2,0,0.0);
        goto LAB_00131fed;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,(Mat *)&local_490,iVar7,iVar7,iVar14,iVar14,0,0.0);
LAB_00131fed:
    iVar14 = -100;
    if (((void *)local_490.params[0]._0_8_ == (void *)0x0) ||
       (iVar10 = local_490.params[0].v.dims, iVar19 = local_490.params[0].v.elemsize._4_4_,
       (long)local_490.params[0].v.w * local_490.params[0].v._32_8_ == 0)) goto LAB_00132477;
  }
  iVar15 = (int)(~uVar24 + iVar19) / this->stride_w;
  iVar14 = (int)(~uVar23 + iVar10) / this->stride_h;
  uVar23 = iVar15 + 1;
  iVar26 = iVar14 + 1;
  iVar10 = this->num_output;
  auVar31._0_4_ = -(uint)(top_blob->dims == 3);
  auVar31._4_4_ = -(uint)(uVar23 == top_blob->w);
  auVar31._8_4_ = -(uint)(iVar26 == top_blob->h);
  auVar31._12_4_ = -(uint)(iVar10 == top_blob->c);
  iVar7 = movmskps(3,auVar31);
  if ((iVar7 == 0xf) && (top_blob->elemsize == 4)) {
    if (top_blob->data != (void *)0x0) {
      sVar27 = top_blob->cstep;
LAB_001321c2:
      if ((long)iVar10 * sVar27 != 0) {
        uVar24 = this->kernel_w * this->kernel_h;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_508,(long)(int)uVar24,
                   (allocator_type *)&local_4a0);
        iVar10 = this->kernel_h;
        if (0 < iVar10) {
          iVar7 = this->dilation_h;
          iVar26 = this->kernel_w;
          iVar8 = this->dilation_w * iVar26;
          iVar9 = 0;
          iVar16 = 0;
          iVar17 = 0;
          do {
            if (0 < iVar26) {
              lVar18 = 0;
              do {
                *(int *)(local_508._0_8_ + (iVar17 + lVar18) * 4) = iVar16;
                iVar16 = iVar16 + this->dilation_w;
                iVar26 = this->kernel_w;
                lVar18 = lVar18 + 1;
              } while ((int)lVar18 < iVar26);
              iVar17 = iVar17 + (int)lVar18;
              iVar10 = this->kernel_h;
            }
            iVar16 = iVar16 + (iVar19 * iVar7 - iVar8);
            iVar9 = iVar9 + 1;
          } while (iVar9 < iVar10);
        }
        iVar19 = this->num_output;
        if (0 < (long)iVar19) {
          pvVar12 = top_blob->data;
          sVar27 = top_blob->cstep;
          sVar4 = top_blob->elemsize;
          iVar10 = 0;
          local_570 = 0;
          do {
            if (-1 < iVar14) {
              pvVar13 = (void *)(sVar27 * sVar4 * local_570 + (long)pvVar12);
              iVar7 = this->bias_term;
              pvVar5 = (this->weight_data).data;
              iVar26 = 0;
              do {
                if (-1 < iVar15) {
                  pvVar6 = (this->bias_data).data;
                  iVar8 = this->stride_h;
                  iVar9 = this->stride_w;
                  uVar20 = 0;
                  do {
                    if (iVar7 == 0) {
                      fVar30 = 0.0;
                    }
                    else {
                      fVar30 = *(float *)((long)pvVar6 + local_570 * 4);
                    }
                    if (0 < (int)uVar1) {
                      uVar28 = 0;
                      pvVar21 = (void *)((long)iVar10 * 4 + (long)pvVar5);
                      do {
                        if (0 < (int)uVar24) {
                          uVar22 = 0;
                          do {
                            fVar30 = fVar30 + *(float *)((long)pvVar21 + uVar22 * 4) *
                                              *(float *)(local_490.params[0]._0_8_ +
                                                        (long)*(int *)(local_508._0_8_ + uVar22 * 4)
                                                        * 4 + local_490.params[0].v._32_8_ *
                                                              (long)local_490.params[0].v.refcount *
                                                              uVar28 + uVar20 * (long)iVar9 * 4 +
                                                                       (long)(local_490.params[0].v.
                                                                              elemsize._4_4_ *
                                                                              iVar26 * iVar8) * 4);
                            uVar22 = uVar22 + 1;
                          } while (uVar24 != uVar22);
                        }
                        uVar28 = uVar28 + 1;
                        pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar24 * 4);
                      } while (uVar28 != uVar1);
                    }
                    *(float *)((long)pvVar13 + uVar20 * 4) = fVar30;
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != uVar23);
                }
                pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar23 * 4);
                bVar29 = iVar26 != iVar14;
                iVar26 = iVar26 + 1;
              } while (bVar29);
            }
            local_570 = local_570 + 1;
            iVar10 = iVar10 + uVar24 * uVar1;
          } while (local_570 != iVar19);
        }
        if ((pointer)local_508._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_508._0_8_,local_4f8._0_8_ - local_508._0_8_);
        }
        iVar14 = 0;
        goto LAB_00132477;
      }
    }
  }
  else {
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = uVar23;
    top_blob->h = iVar26;
    top_blob->c = iVar10;
    sVar27 = (long)(int)(iVar26 * uVar23) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = sVar27;
    lVar18 = (long)iVar10 * sVar27;
    if (lVar18 != 0) {
      pvVar12 = malloc(lVar18 * 4 + 0x1c);
      pvVar13 = (void *)((long)pvVar12 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar13 - 8) = pvVar12;
      top_blob->data = pvVar13;
      piVar2 = (int *)((long)pvVar13 + lVar18 * 4);
      top_blob->refcount = piVar2;
      *piVar2 = 1;
      iVar10 = top_blob->c;
      goto LAB_001321c2;
    }
  }
  iVar14 = -100;
LAB_00132477:
  if ((int *)local_490.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)local_490.params[0].v.data = *local_490.params[0].v.data + -1;
    UNLOCK();
    if ((*local_490.params[0].v.data == 0) && ((void *)local_490.params[0]._0_8_ != (void *)0x0)) {
      free(*(void **)(local_490.params[0]._0_8_ + -8));
    }
  }
  return iVar14;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}